

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoostTestApprovals.h
# Opt level: O2

void __thiscall
ApprovalTests::BoostApprovalListener::test_unit_start(BoostApprovalListener *this,test_unit *test)

{
  TestName *this_00;
  string path;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,(test->p_file_name).m_begin,(test->p_file_name).m_end);
  this_00 = &this->currentTest;
  TestName::setFileName(this_00,&local_58);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this_00->sections,(value_type *)&test->p_name);
  FrameworkIntegrations::setCurrentTest(this_00);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/boost_test/BoostTestApprovals.h:24:17)>
             ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/boost_test/BoostTestApprovals.h:24:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_38);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void test_unit_start(boost::unit_test::test_unit const& test) override
        {
            std::string path(test.p_file_name.begin(), test.p_file_name.end());
            currentTest.setFileName(path);

            currentTest.sections.push_back(test.p_name);
            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { BOOST_CHECK(true); });
        }